

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O0

SSVectorBase<double> * __thiscall
soplex::SSVectorBase<double>::assign2productShort<double,double>
          (SSVectorBase<double> *this,SVSetBase<double> *A,SSVectorBase<double> *x)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  const_reference pvVar5;
  SVectorBase<double> *pSVar6;
  element_type *peVar7;
  Nonzero<double> *pNVar8;
  reference pvVar9;
  long in_RDX;
  SSVectorBase<double> *in_RDI;
  double dVar10;
  int i_1;
  int nz_counter;
  double oldval;
  Nonzero<double> *elt_1;
  int j_1;
  SVectorBase<double> *Ai;
  double xi;
  int i;
  double product;
  Nonzero<double> *elt;
  int j;
  int Aisize;
  int xsize;
  int nonzero_idx;
  SVectorBase<double> *A0;
  double x0;
  int curidx;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  SVSetBase<double> *in_stack_ffffffffffffff40;
  value_type a;
  int local_90;
  int local_8c;
  int local_74;
  int local_5c;
  int local_48;
  int local_3c;
  
  iVar3 = size((SSVectorBase<double> *)0x24aa19);
  if (iVar3 == 0) {
    clear((SSVectorBase<double> *)in_stack_ffffffffffffff40);
  }
  else {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDX + 0x20),
                        (long)**(int **)(in_RDX + 0x10));
    dVar1 = *pvVar5;
    pSVar6 = SVSetBase<double>::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    local_3c = 0;
    iVar3 = size((SSVectorBase<double> *)0x24aaa9);
    iVar4 = SVectorBase<double>::size(pSVar6);
    (in_RDI->super_IdxSet).num = iVar4;
    tolerances(in_RDI);
    peVar7 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x24aae1);
    Tolerances::epsilon(peVar7);
    bVar2 = isZero<double,double>
                      ((double)in_stack_ffffffffffffff40,
                       (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    if ((bVar2) || ((in_RDI->super_IdxSet).num == 0)) {
      clear((SSVectorBase<double> *)in_stack_ffffffffffffff40);
    }
    else {
      for (local_48 = 0; local_48 < (in_RDI->super_IdxSet).num; local_48 = local_48 + 1) {
        pNVar8 = SVectorBase<double>::element(pSVar6,local_48);
        dVar10 = dVar1 * pNVar8->val;
        (in_RDI->super_IdxSet).idx[local_3c] = pNVar8->idx;
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&(in_RDI->super_VectorBase<double>).val,(long)pNVar8->idx);
        *pvVar9 = dVar10;
        if ((dVar10 != 0.0) || (NAN(dVar10))) {
          local_3c = local_3c + 1;
        }
      }
    }
    for (local_5c = 1; local_5c < iVar3; local_5c = local_5c + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDX + 0x20),
                          (long)*(int *)(*(long *)(in_RDX + 0x10) + (long)local_5c * 4));
      dVar1 = *pvVar5;
      pSVar6 = SVSetBase<double>::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      iVar4 = SVectorBase<double>::size(pSVar6);
      tolerances(in_RDI);
      peVar7 = std::
               __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x24ac87);
      Tolerances::epsilon(peVar7);
      bVar2 = isNotZero<double,double>
                        ((double)in_stack_ffffffffffffff40,
                         (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      if ((bVar2) || (iVar4 == 0)) {
        for (local_74 = 0; local_74 < iVar4; local_74 = local_74 + 1) {
          pNVar8 = SVectorBase<double>::element(pSVar6,local_74);
          (in_RDI->super_IdxSet).idx[local_3c] = pNVar8->idx;
          pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&(in_RDI->super_VectorBase<double>).val,(long)pNVar8->idx);
          dVar10 = *pvVar9;
          if ((dVar10 == 0.0) && (!NAN(dVar10))) {
            local_3c = local_3c + 1;
          }
          dVar10 = dVar1 * pNVar8->val + dVar10;
          if ((dVar10 != 0.0) || (NAN(dVar10))) {
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&(in_RDI->super_VectorBase<double>).val,(long)pNVar8->idx);
            *pvVar9 = dVar10;
          }
          else {
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&(in_RDI->super_VectorBase<double>).val,(long)pNVar8->idx);
            *pvVar9 = 1e-100;
          }
        }
      }
    }
    local_8c = 0;
    for (local_90 = 0; local_90 < local_3c; local_90 = local_90 + 1) {
      iVar3 = (in_RDI->super_IdxSet).idx[local_90];
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&(in_RDI->super_VectorBase<double>).val,(long)iVar3);
      a = *pvVar9;
      tolerances(in_RDI);
      peVar7 = std::
               __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x24ae3f);
      Tolerances::epsilon(peVar7);
      bVar2 = isZero<double,double>
                        (a,(double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      if (bVar2) {
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&(in_RDI->super_VectorBase<double>).val,(long)iVar3);
        *pvVar9 = 0.0;
      }
      else {
        (in_RDI->super_IdxSet).idx[local_8c] = iVar3;
        local_8c = local_8c + 1;
      }
      (in_RDI->super_IdxSet).num = local_8c;
    }
  }
  return in_RDI;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::assign2productShort(const SVSetBase<S>& A,
      const SSVectorBase<T>& x)
{
   assert(x.isSetup());

   if(x.size() == 0)   // x can be setup but have size 0 => this := zero vector
   {
      clear();
      return *this;
   }

   // compute x[0] * A[0]
   int curidx = x.idx[0];
   const T x0 = x.val[curidx];
   const SVectorBase<S>& A0 = A[curidx];
   int nonzero_idx = 0;
   int xsize = x.size();
   int Aisize;

   num = A0.size();

   if(isZero(x0, this->tolerances()->epsilon()) || num == 0)
   {
      // A[0] == 0 or x[0] == 0 => this := zero vector
      clear();
   }
   else
   {
      for(int j = 0; j < num; ++j)
      {
         const Nonzero<S>& elt = A0.element(j);
         const R product = x0 * elt.val;

         // store the value in any case
         idx[nonzero_idx] = elt.idx;
         VectorBase<R>::val[elt.idx] = product;

         // count only non-zero values; not 'isNotZero(product, epsilon)'
         if(product != 0)
            ++nonzero_idx;
      }
   }

   // Compute the other x[i] * A[i] and add them to the existing vector.
   for(int i = 1; i < xsize; ++i)
   {
      curidx = x.idx[i];
      const T xi     = x.val[curidx];
      const SVectorBase<S>& Ai = A[curidx];

      // If A[i] == 0 or x[i] == 0, do nothing.
      Aisize = Ai.size();

      if(isNotZero(xi, this->tolerances()->epsilon()) || Aisize == 0)
      {
         // Compute x[i] * A[i] and add it to the existing vector.
         for(int j = 0; j < Aisize; ++j)
         {
            const Nonzero<S>& elt = Ai.element(j);
            idx[nonzero_idx] = elt.idx;
            R oldval  = VectorBase<R>::val[elt.idx];

            // An old value of exactly 0 means the position is still unused.
            // It will be used now (either by a new nonzero or by a SOPLEX_VECTOR_MARKER),
            // so increase the counter. If oldval != 0, we just
            // change an existing NZ-element, so don't increase the counter.
            if(oldval == 0)
               ++nonzero_idx;

            // Add the current product x[i] * A[i][j]; if oldval was
            // SOPLEX_VECTOR_MARKER before, it does not hurt because SOPLEX_VECTOR_MARKER is really small.
            oldval += xi * elt.val;

            // If the new value is exactly 0, mark the index as used
            // by setting a value which is nearly 0; otherwise, store
            // the value. Values below epsilon will be removed later.
            if(oldval == 0)
               VectorBase<R>::val[elt.idx] = SOPLEX_VECTOR_MARKER;
            else
               VectorBase<R>::val[elt.idx] = oldval;
         }
      }
   }

   // Clean up by shifting all nonzeros (w.r.t. epsilon) to the front of idx,
   // zeroing all values which are nearly 0, and setting #num# appropriately.
   int nz_counter = 0;

   for(int i = 0; i < nonzero_idx; ++i)
   {
      curidx = idx[i];

      if(isZero(VectorBase<R>::val[curidx], this->tolerances()->epsilon()))
         VectorBase<R>::val[curidx] = 0;
      else
      {
         idx[nz_counter] = curidx;
         ++nz_counter;
      }

      num = nz_counter;
   }

   assert(isConsistent());

   return *this;
}